

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O1

Section * mocker::genDataSection(Section *__return_storage_ptr__,Module *irModule)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Module *pMVar2;
  char *local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,".data","");
  paVar1 = &(__return_storage_ptr__->name).field_2;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)paVar1;
  if (local_70 == &local_60) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    *(undefined8 *)((long)&(__return_storage_ptr__->name).field_2 + 8) = uStack_58;
  }
  else {
    (__return_storage_ptr__->name)._M_dataplus._M_p = local_70;
    (__return_storage_ptr__->name).field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
  }
  (__return_storage_ptr__->name)._M_string_length = local_68;
  local_68 = 0;
  local_60 = '\0';
  (__return_storage_ptr__->lines).
  super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&__return_storage_ptr__->lines;
  (__return_storage_ptr__->lines).
  super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&__return_storage_ptr__->lines;
  (__return_storage_ptr__->lines).
  super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl._M_node._M_size
       = 0;
  pMVar2 = (Module *)
           (irModule->globalVars).
           super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (pMVar2 != irModule) {
    local_70 = &local_60;
    do {
      std::operator+(&local_50,"L",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &(pMVar2->globalVars).
                      super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>
                      ._M_impl._M_node._M_size);
      nasm::Section::emplaceLine<mocker::nasm::Db,std::__cxx11::string_const&>
                (__return_storage_ptr__,&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(pMVar2->funcs)._M_h._M_element_count);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pMVar2 = (Module *)
               (pMVar2->globalVars).
               super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>.
               _M_impl._M_node.super__List_node_base._M_next;
    } while (pMVar2 != irModule);
  }
  return __return_storage_ptr__;
}

Assistant:

nasm::Section genDataSection(const ir::Module &irModule) {
  nasm::Section res(".data");
  for (auto &var : irModule.getGlobalVars()) {
    res.emplaceLine<nasm::Db>("L" + var.getLabel(), var.getData());
  }
  return res;
}